

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::Triangulate(dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes,dgPolyhedra *leftOver)

{
  int iVar1;
  uint uVar2;
  dgRedBackNode *pdVar3;
  HaI32 HVar4;
  dgEdge *pdVar5;
  dgEdge **index;
  int iVar6;
  dgEdge *pdVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  Iterator local_78;
  dgDownHeap<dgEdge_*,_double> heap;
  dgStack<char> memPool;
  
  dgStack<char>::dgStack(&memPool,((this->super_dgTree<dgEdge,_long>).m_count / 2) * 0x10 + 0x2000);
  heap.super_dgHeapBase<dgEdge_*,_double>.m_pool = (RECORD *)dgStack<char>::operator[](&memPool,0);
  heap.super_dgHeapBase<dgEdge_*,_double>.m_maxCount = memPool.m_size >> 4;
  heap.super_dgHeapBase<dgEdge_*,_double>.m_curCount = 0;
  HVar4 = IncLRU(this);
  local_78.m_tree = &this->super_dgTree<dgEdge,_long>;
  local_78.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  while( true ) {
    do {
      do {
        do {
          pdVar3 = local_78.m_ptr;
          if ((dgTreeNode *)local_78.m_ptr == (dgTreeNode *)0x0) {
            OptimizeTriangulation(this,vertex,strideInBytes);
            HVar4 = IncLRU(this);
            this->m_faceSecuence = 1;
            local_78.m_ptr = &dgTree<dgEdge,_long>::Minimum(local_78.m_tree)->super_dgRedBackNode;
            do {
              if ((dgTreeNode *)local_78.m_ptr == (dgTreeNode *)0x0) {
                free(heap.super_dgHeapBase<dgEdge_*,_double>.m_pool);
                free(memPool.super_dgStackBase.m_ptr);
                return;
              }
              if ((((dgEdge *)((long)local_78.m_ptr + 0x28))->m_mark != HVar4) &&
                 (-1 < ((dgEdge *)((long)local_78.m_ptr + 0x28))->m_incidentFace)) {
                pdVar5 = (dgEdge *)((long)local_78.m_ptr + 0x28);
                if (pdVar5 != ((dgEdge *)((long)local_78.m_ptr + 0x28))->m_next->m_next->m_next) {
                  __assert_fail("edge == edge->m_next->m_next->m_next",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0xdc2,
                                "void dgPolyhedra::Triangulate(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                               );
                }
                iVar1 = this->m_faceSecuence;
                iVar6 = 3;
                while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
                  pdVar5->m_incidentFace = iVar1;
                  pdVar5->m_mark = HVar4;
                  pdVar5 = pdVar5->m_next;
                }
                this->m_faceSecuence = iVar1 + 1;
              }
              dgTree<dgEdge,_long>::Iterator::operator++(&local_78,0);
            } while( true );
          }
          dgTree<dgEdge,_long>::Iterator::operator++(&local_78,0);
        } while ((((dgEdge *)((long)pdVar3 + 0x28))->m_mark == HVar4) ||
                (((dgEdge *)((long)pdVar3 + 0x28))->m_incidentFace < 0));
        pdVar7 = (dgEdge *)((long)pdVar3 + 0x28);
        lVar10 = 0;
        uVar9 = 0;
        pdVar5 = pdVar7;
        do {
          pdVar5->m_mark = HVar4;
          uVar2 = (uint)uVar9;
          uVar9 = (ulong)(uVar2 + 1);
          lVar10 = lVar10 + 4;
          pdVar5 = pdVar5->m_next;
        } while (pdVar5 != pdVar7);
      } while (uVar2 < 3);
      pdVar5 = TriangulateFace(this,pdVar7,vertex,strideInBytes >> 3,&heap,(dgBigVector *)0x0);
      heap.super_dgHeapBase<dgEdge_*,_double>.m_curCount = 0;
    } while (pdVar5 == (dgEdge *)0x0);
    if (pdVar5->m_incidentFace < 1) break;
    if (leftOver != (dgPolyhedra *)0x0) {
      index = dgHeapBase<dgEdge_*,_double>::operator[](&heap.super_dgHeapBase<dgEdge_*,_double>,0);
      lVar8 = 0;
      pdVar7 = pdVar5;
      do {
        *(HaI32 *)((long)index + lVar8 * 4) = pdVar7->m_incidentVertex;
        *(HaU64 *)((long)index + lVar8 * 8 + lVar10) = pdVar7->m_userData;
        lVar8 = lVar8 + 1;
        pdVar7 = pdVar7->m_next;
      } while (pdVar7 != pdVar5);
      AddFace(leftOver,(HaI32)lVar8,(HaI32 *)index,(HaI64 *)((long)index + uVar9 * 4));
    }
    DeleteFace(this,pdVar5);
    local_78.m_ptr = &dgTree<dgEdge,_long>::Minimum(local_78.m_tree)->super_dgRedBackNode;
  }
  __assert_fail("edge->m_incidentFace > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                ,0xd96,
                "void dgPolyhedra::Triangulate(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
               );
}

Assistant:

void dgPolyhedra::Triangulate (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes, dgPolyhedra* const leftOver)
{
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	hacd::HaI32 count = GetCount() / 2;
	dgStack<char> memPool (hacd::HaI32 ((count + 512) * (2 * sizeof (hacd::HaF64)))); 
	dgDownHeap<dgEdge*, hacd::HaF64> heap(&memPool[0], memPool.GetSizeInBytes());

	hacd::HaI32 mark = IncLRU();
	Iterator iter (*this);
	for (iter.Begin(); iter; ) {
		dgEdge* const thisEdge = &(*iter);
		iter ++;

		if (thisEdge->m_mark == mark) {
			continue;
		}
		if (thisEdge->m_incidentFace < 0) {
			continue;
		}

		count = 0;
		dgEdge* ptr = thisEdge;
		do {
			count ++;
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != thisEdge);

		if (count > 3) {
			dgEdge* const edge = TriangulateFace (thisEdge, vertex, stride, heap, NULL);
			heap.Flush ();

			if (edge) {
				HACD_ASSERT (edge->m_incidentFace > 0);

				if (leftOver) {
					hacd::HaI32* const index = (hacd::HaI32 *) &heap[0];
					hacd::HaI64* const data = (hacd::HaI64 *)&index[count];
					hacd::HaI32 i = 0;
					dgEdge* ptr = edge;
					do {
						index[i] = ptr->m_incidentVertex;
						data[i] = hacd::HaI64 (ptr->m_userData);
						i ++;
						ptr = ptr->m_next;
					} while (ptr != edge);
					leftOver->AddFace(i, index, data);

				} 
				else 
				{
//					dgTrace (("Deleting face:"));					
//					ptr = edge;
//					do {
//						dgTrace (("%d ", ptr->m_incidentVertex));
//					} while (ptr != edge);
////					dgTrace (("\n"));					
				}

				DeleteFace (edge);
				iter.Begin();
			}
		}
	}

	OptimizeTriangulation (vertex, strideInBytes);

	mark = IncLRU();
	m_faceSecuence = 1;
	for (iter.Begin(); iter; iter ++) {
		dgEdge* edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}
		if (edge->m_incidentFace < 0) {
			continue;
		}
		HACD_ASSERT (edge == edge->m_next->m_next->m_next);

		for (hacd::HaI32 i = 0; i < 3; i ++) { 
			edge->m_incidentFace = m_faceSecuence; 
			edge->m_mark = mark;
			edge = edge->m_next;
		}
		m_faceSecuence ++;
	}
}